

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QVariant * __thiscall
Mustache::QtVariantContext::value
          (QVariant *__return_storage_ptr__,QtVariantContext *this,QString *key)

{
  long lVar1;
  QVariant *pQVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  QStringList keyPath;
  QArrayDataPointer<QString> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  bVar3 = QString::operator==(key,".");
  if ((bVar3) && (lVar1 = (this->m_contextStack).super_QList<QVariant>.d.size, lVar1 != 0)) {
    ::QVariant::QVariant
              (__return_storage_ptr__,
               (QVariant *)((this->m_contextStack).super_QList<QVariant>.d.ptr + lVar1 + -1));
  }
  else {
    QString::QString((QString *)&local_38,".");
    QString::split(&keyPath,key,&local_38,0,1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    uVar5 = (uint)(this->m_contextStack).super_QList<QVariant>.d.size;
    while( true ) {
      uVar5 = uVar5 - 1;
      if ((int)uVar5 < 0) break;
      pQVar2 = (this->m_contextStack).super_QList<QVariant>.d.ptr;
      local_50.d = keyPath.d.d;
      local_50.ptr = keyPath.d.ptr;
      local_50.size = keyPath.d.size;
      if (keyPath.d.d != (Data *)0x0) {
        LOCK();
        ((keyPath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((keyPath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      variantMapValueForKeyPath
                (__return_storage_ptr__,pQVar2 + (uVar5 & 0x7fffffff),(QStringList *)&local_50);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
      cVar4 = ::QVariant::isNull();
      if (cVar4 == '\0') goto LAB_00110bed;
      ::QVariant::~QVariant(__return_storage_ptr__);
    }
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_00110bed:
    QArrayDataPointer<QString>::~QArrayDataPointer(&keyPath.d);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QtVariantContext::value(const QString& key) const
{
	if (key == "." && !m_contextStack.isEmpty()) {
		return m_contextStack.last();
	}
	QStringList keyPath = key.split(".");
	for (int i = m_contextStack.count()-1; i >= 0; i--) {
		QVariant value = variantMapValueForKeyPath(m_contextStack.at(i), keyPath);
		if (!value.isNull()) {
			return value;
		}
	}
	return QVariant();
}